

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_flamestrike(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int dam;
  bool bVar1;
  int iVar2;
  
  iVar2 = dice(level / 2 + 6,8);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,4);
  dam = iVar2 / 2;
  if (!bVar1) {
    dam = iVar2;
  }
  damage_old(ch,(CHAR_DATA *)vo,dam,sn,4,true);
  return;
}

Assistant:

void spell_flamestrike(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(6 + level / 2, 8);

	if (saves_spell(level, victim, DAM_FIRE))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_FIRE, true);
}